

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  void *pvVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  float *ptr;
  long lVar6;
  long lVar7;
  float fVar8;
  int id;
  int len;
  char vstr [16];
  uint local_50;
  int local_4c;
  char local_48 [24];
  
  clear(this);
  local_50 = 0;
  iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d=");
  if (iVar4 == 1) {
    do {
      uVar2 = local_50;
      if ((int)local_50 < -0x5b03) {
        local_50 = -local_50 - 0x5b04;
      }
      if (0x1f < (int)local_50) {
        load_param((ParamDict *)(ulong)local_50);
        return -1;
      }
      if ((int)uVar2 < -0x5b03) {
        local_4c = 0;
        iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_4c);
        if (iVar4 != 1) {
          load_param();
          return -1;
        }
        Mat::create(&this->d->params[(int)local_50].v,local_4c,4,(Allocator *)0x0);
        if (0 < local_4c) {
          lVar7 = 0;
          lVar6 = 0;
          do {
            iVar4 = (*dr->_vptr_DataReader[2])(dr,",%15[^,\n ]",local_48);
            if (iVar4 != 1) {
              load_param();
              goto LAB_001715d6;
            }
            bVar3 = vstr_is_float(local_48);
            pvVar1 = this->d->params[(int)local_50].v.data;
            if (bVar3) {
              fVar8 = vstr_to_float(local_48);
              *(float *)((long)pvVar1 + lVar7) = fVar8;
              iVar5 = 6;
            }
            else {
              iVar4 = __isoc99_sscanf(local_48,"%d",(long)pvVar1 + lVar7);
              iVar5 = 5;
              if (iVar4 != 1) {
                load_param();
                goto LAB_001715d6;
              }
            }
            this->d->params[(int)local_50].type = iVar5;
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 4;
          } while (lVar6 < local_4c);
        }
      }
      else {
        iVar4 = (*dr->_vptr_DataReader[2])(dr,"%15s",local_48);
        if (iVar4 != 1) {
          load_param();
LAB_001715d6:
          fputc(10,_stderr);
          return -1;
        }
        bVar3 = vstr_is_float(local_48);
        if (bVar3) {
          fVar8 = vstr_to_float(local_48);
          this->d->params[(int)local_50].field_1.f = fVar8;
          iVar5 = 3;
        }
        else {
          iVar4 = __isoc99_sscanf(local_48,"%d",&this->d->params[(int)local_50].field_1);
          iVar5 = 2;
          if (iVar4 != 1) {
            load_param();
            goto LAB_001715d6;
          }
        }
        this->d->params[(int)local_50].type = iVar5;
      }
      iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d=",&local_50);
    } while (iVar4 == 1);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    //     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read value failed");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}